

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Client * __thiscall
capnproto_test::capnp::test::TestMoreStuff::GetHeldResults::Reader::getCap
          (Client *__return_storage_ptr__,Reader *this)

{
  PointerReader reader;
  uint ptrIndex;
  undefined8 in_stack_ffffffffffffffa8;
  PointerReader local_38;
  Reader *local_18;
  Reader *this_local;
  
  local_18 = this;
  this_local = (Reader *)__return_storage_ptr__;
  ptrIndex = ::capnp::bounded<0u>();
  ::capnp::_::StructReader::getPointerField(&local_38,&this->_reader,ptrIndex);
  reader.capTable = (CapTableReader *)local_38.pointer;
  reader.segment = (SegmentReader *)local_38.capTable;
  reader.pointer = (WirePointer *)local_38._24_8_;
  reader._24_8_ = in_stack_ffffffffffffffa8;
  ::capnp::_::PointerHelpers<capnproto_test::capnp::test::TestInterface,_(capnp::Kind)5>::get
            (reader);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnproto_test::capnp::test::TestInterface::Client TestMoreStuff::GetHeldResults::Reader::getCap() const {
  return ::capnp::_::PointerHelpers< ::capnproto_test::capnp::test::TestInterface>::get(_reader.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS));
}